

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
client_socket::set_on_read_write
          (client_socket *this,on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  _Head_base<0UL,_client_socket::impl_*,_false> _Var1;
  
  std::function<void_()>::operator=
            (&((this->pimpl)._M_t.
               super___uniq_ptr_impl<client_socket::impl,_std::default_delete<client_socket::impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_client_socket::impl_*,_std::default_delete<client_socket::impl>_>
               .super__Head_base<0UL,_client_socket::impl_*,_false>._M_head_impl)->on_read_ready,
             on_read_ready);
  std::function<void_()>::operator=
            (&((this->pimpl)._M_t.
               super___uniq_ptr_impl<client_socket::impl,_std::default_delete<client_socket::impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_client_socket::impl_*,_std::default_delete<client_socket::impl>_>
               .super__Head_base<0UL,_client_socket::impl_*,_false>._M_head_impl)->on_write_ready,
             on_write_ready);
  _Var1._M_head_impl =
       (this->pimpl)._M_t.
       super___uniq_ptr_impl<client_socket::impl,_std::default_delete<client_socket::impl>_>._M_t.
       super__Tuple_impl<0UL,_client_socket::impl_*,_std::default_delete<client_socket::impl>_>.
       super__Head_base<0UL,_client_socket::impl_*,_false>._M_head_impl;
  sysapi::epoll_registration::modify
            (&(_Var1._M_head_impl)->reg,
             (uint)(*(_Manager_type *)((long)&(_Var1._M_head_impl)->on_read_ready + 0x10) !=
                   (_Manager_type)0x0) +
             (uint)(*(_Manager_type *)((long)&(_Var1._M_head_impl)->on_write_ready + 0x10) !=
                   (_Manager_type)0x0) * 4 + 0x2000);
  return;
}

Assistant:

void client_socket::set_on_read_write(on_ready_t on_read_ready,
                                      on_ready_t on_write_ready)
{
    pimpl->on_read_ready = std::move(on_read_ready);
    pimpl->on_write_ready = std::move(on_write_ready);
    pimpl->update_registration();
}